

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImGui::FindRenderedTextEnd(char *text,char *text_end)

{
  bool bVar1;
  char *local_20;
  char *text_display_end;
  char *text_end_local;
  char *text_local;
  
  local_20 = text;
  text_display_end = text_end;
  if (text_end == (char *)0x0) {
    text_display_end = (char *)0xffffffffffffffff;
  }
  while( true ) {
    bVar1 = false;
    if (((local_20 < text_display_end) && (bVar1 = false, *local_20 != '\0')) &&
       (bVar1 = true, *local_20 == '#')) {
      bVar1 = local_20[1] != '#';
    }
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

const char* ImGui::FindRenderedTextEnd(const char* text, const char* text_end)
{
    const char* text_display_end = text;
    if (!text_end)
        text_end = (const char*)-1;

    while (text_display_end < text_end && *text_display_end != '\0' && (text_display_end[0] != '#' || text_display_end[1] != '#'))
        text_display_end++;
    return text_display_end;
}